

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmn_live.c
# Opt level: O3

void cmn_live_set(cmn_t *cmn,mfcc_t *vec)

{
  float fVar1;
  int iVar2;
  mfcc_t *pmVar3;
  mfcc_t *pmVar4;
  char *pcVar5;
  long lVar6;
  
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/feat/cmn_live.c"
          ,0x38,"Update from < %s >\n",cmn->repr);
  iVar2 = cmn->veclen;
  if (0 < (long)iVar2) {
    pmVar3 = cmn->cmn_mean;
    pmVar4 = cmn->sum;
    lVar6 = 0;
    do {
      fVar1 = (float)vec[lVar6];
      pmVar3[lVar6] = (mfcc_t)fVar1;
      pmVar4[lVar6] = (mfcc_t)(fVar1 * 500.0);
      lVar6 = lVar6 + 1;
    } while (iVar2 != lVar6);
  }
  cmn->nframe = 500;
  pcVar5 = cmn_update_repr(cmn);
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/feat/cmn_live.c"
          ,0x3e,"Update to   < %s >\n",pcVar5);
  return;
}

Assistant:

void
cmn_live_set(cmn_t *cmn, mfcc_t const * vec)
{
    int32 i;

    E_INFO("Update from < %s >\n", cmn->repr);
    for (i = 0; i < cmn->veclen; i++) {
        cmn->cmn_mean[i] = vec[i];
        cmn->sum[i] = vec[i] * CMN_WIN;
    }
    cmn->nframe = CMN_WIN;
    E_INFO("Update to   < %s >\n", cmn_update_repr(cmn));
}